

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglBufferAgeTests.cpp
# Opt level: O1

string * __thiscall
deqp::egl::(anonymous_namespace)::generateDrawTypeName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,
          vector<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::BufferAgeTest::DrawType>_>
          *drawTypes)

{
  int iVar1;
  long lVar2;
  char *pcVar3;
  ulong uVar4;
  ostringstream stream;
  undefined1 auStack_1a8 [376];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_1a8);
  if (*(long *)(this + 8) == *(long *)this) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"_none","");
  }
  else {
    lVar2 = *(long *)this;
    if (*(long *)(this + 8) != lVar2) {
      uVar4 = 0;
      do {
        iVar1 = *(int *)(lVar2 + uVar4 * 4);
        if (iVar1 == 0) {
          lVar2 = 6;
          pcVar3 = "_clear";
LAB_00e57dcb:
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_1a8,pcVar3,lVar2);
        }
        else if (iVar1 == 1) {
          lVar2 = 7;
          pcVar3 = "_render";
          goto LAB_00e57dcb;
        }
        uVar4 = uVar4 + 1;
        lVar2 = *(long *)this;
      } while (uVar4 < (ulong)(*(long *)(this + 8) - lVar2 >> 2));
    }
    std::__cxx11::stringbuf::str();
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_1a8);
  std::ios_base::~ios_base((ios_base *)(auStack_1a8 + 0x70));
  return __return_storage_ptr__;
}

Assistant:

string generateDrawTypeName (const vector<BufferAgeTest::DrawType>& drawTypes)
{
	std::ostringstream stream;
	if (drawTypes.size() == 0)
		return string("_none");

	for (size_t ndx = 0; ndx < drawTypes.size(); ndx++)
	{
		if (drawTypes[ndx] == BufferAgeTest::DRAWTYPE_GLES2_RENDER)
			stream << "_render";
		else if (drawTypes[ndx] == BufferAgeTest::DRAWTYPE_GLES2_CLEAR)
			stream << "_clear";
		else
			DE_ASSERT(false);
	}
	return stream.str();
}